

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

string * __thiscall
TestNLHandler::EndNumberOf_abi_cxx11_
          (string *__return_storage_ptr__,TestNLHandler *this,ArgHandler *h)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (h->name_)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (h->name_)._M_string_length);
  MakeVarArg(__return_storage_ptr__,this,&local_48,&h->args_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EndNumberOf(ArgHandler h) { return MakeVarArg(h.name_, h.args_); }